

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O2

void __thiscall
chrono::ChLoad<MyLoaderTriangular>::LoadGetStateBlock_x
          (ChLoad<MyLoaderTriangular> *this,ChState *mD)

{
  long *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChLoadableU,void>
            ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             &(this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
              super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*local_20 + 0x20))(local_20,0,mD);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

inline void ChLoad<Tloader>::LoadGetStateBlock_x(ChState& mD) {
    this->loader.GetLoadable()->LoadableGetStateBlock_x(0, mD);
}